

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSprite __thiscall
DataSourceAmiga::get_game_object_sprite(DataSourceAmiga *this,size_t catalog,size_t index)

{
  uint8_t compression;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t filling;
  uint8_t *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  byte bVar7;
  PBuffer *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *data_00;
  PSprite PVar8;
  PSpriteAmiga sprite;
  PBuffer data;
  undefined1 local_90 [16];
  PSpriteAmiga pixels;
  PSpriteAmiga mask;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,(__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(catalog + 0x58));
  get_data_from_catalog((DataSourceAmiga *)&data,catalog,index,in_RCX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
         (_func_int **)0x0;
    (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    puVar5 = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    compression = *puVar5;
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 1;
    bVar1 = puVar5[1];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 2;
    bVar2 = puVar5[2];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 3;
    bVar3 = puVar5[3];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 4;
    bVar4 = puVar5[4];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 5;
    filling = puVar5[5];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 6;
    bVar7 = 0x10;
    if (0x10 < bVar2) {
      bVar7 = bVar2;
    }
    data_00 = &data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,data_00);
    decode_mask_sprite((DataSourceAmiga *)&mask,(PBuffer *)data_00,(size_t)&local_50,
                       (ulong)(bVar7 + 7 & 0xfffffff8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    Buffer::pop_tail((Buffer *)local_90);
    decode_planned_sprite
              ((DataSourceAmiga *)&pixels,(PBuffer *)(ulong)bVar4,(size_t)local_90,
               (ulong)(bVar7 + 7 >> 3),compression,filling,(uint8_t *)(ulong)bVar4,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<DataSourceAmiga::SpriteAmiga,void>
              (local_60,&mask.
                         super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
              );
    SpriteAmiga::get_amiga_masked
              ((SpriteAmiga *)&sprite,
               (PSprite *)
               pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    _Var6 = sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    if (sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)0x0;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).delta_x = 1;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).delta_y = 0;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).offset_x = -(uint)bVar3;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).offset_y = -(uint)bVar1;
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)
           sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p =
           (pointer)_Var6._M_pi;
      sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_game_object_sprite(size_t catalog, size_t index) {
  PBuffer data = get_data_from_catalog(catalog, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  uint8_t h = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t w = data->pop<uint8_t>();
  uint8_t offset_x = data->pop<uint8_t>();
  uint8_t filling = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (w < 16) w = 16;

  int width = (w+7)/8;

  PSpriteAmiga mask = decode_mask_sprite(data, width*8, h);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, h,
                                              compression, filling, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  if (!sprite) {
    return nullptr;
  }
  sprite->set_delta(1, 0);
  sprite->set_offset(-offset_x, -offset_y);

  return sprite;
}